

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

OBS_TYPE __thiscall
despot::Parser::GetPOMDPXObservation
          (Parser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *observe)

{
  OBS_TYPE OVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference this_00;
  string *__k;
  mapped_type *pmVar6;
  string local_48;
  int local_28;
  int local_24;
  int index;
  int o;
  OBS_TYPE obs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *observe_local;
  Parser *this_local;
  
  _index = 0;
  local_24 = 0;
  obs = (OBS_TYPE)observe;
  observe_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)this;
  while( true ) {
    uVar3 = (ulong)local_24;
    sVar4 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size(&this->obs_vars_)
    ;
    if (sVar4 <= uVar3) break;
    pvVar5 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)local_24);
    OVar1 = obs;
    this_00 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                        (&this->obs_vars_,(long)local_24);
    __k = NamedVar::name_abi_cxx11_(this_00);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)OVar1,__k);
    std::__cxx11::string::string((string *)&local_48,(string *)pmVar6);
    iVar2 = Variable::IndexOf(&pvVar5->super_Variable,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    OVar1 = _index;
    local_28 = iVar2;
    pvVar5 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                       (&this->obs_vars_,(long)local_24);
    iVar2 = Variable::Size(&pvVar5->super_Variable);
    _index = OVar1 * (long)iVar2 + (long)local_28;
    local_24 = local_24 + 1;
  }
  return _index;
}

Assistant:

OBS_TYPE Parser::GetPOMDPXObservation(map<string, string>& observe) {
	OBS_TYPE obs = 0;
	for (int o = 0; o < obs_vars_.size(); o++) {
		int index = obs_vars_[o].IndexOf(observe[obs_vars_[o].name()]);
		obs = obs * obs_vars_[o].Size() + index;
	}
	return obs;
}